

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O3

void agg::qsort_cells<agg::cell_aa>(cell_aa **start,uint num)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  cell_aa *pcVar4;
  long lVar5;
  cell_aa **ppcVar6;
  cell_aa **ppcVar7;
  cell_aa **ppcVar8;
  ulong uVar9;
  cell_aa **ppcVar10;
  cell_aa *temp_4;
  cell_aa **ppcVar11;
  cell_aa *temp_1;
  cell_aa *pcVar12;
  cell_aa *temp_3;
  cell_aa *pcVar13;
  cell_aa *temp;
  long lVar14;
  undefined8 local_2a8 [80];
  
  puVar1 = local_2a8;
  ppcVar6 = start + num;
  do {
    while (ppcVar10 = start, 9 < (int)((ulong)((long)ppcVar6 - (long)start) >> 3)) {
      uVar9 = (ulong)((long)ppcVar6 - (long)start) >> 1 & 0x3fffffff8;
      pcVar4 = *start;
      *start = *(cell_aa **)((long)start + uVar9);
      *(cell_aa **)((long)start + uVar9) = pcVar4;
      ppcVar10 = start + 1;
      ppcVar11 = ppcVar6 + -1;
      pcVar13 = ppcVar6[-1];
      pcVar4 = start[1];
      iVar2 = pcVar4->x;
      pcVar12 = pcVar4;
      if (pcVar13->x < iVar2) {
        *ppcVar10 = pcVar13;
        *ppcVar11 = pcVar4;
        pcVar12 = *ppcVar10;
        iVar2 = pcVar12->x;
        pcVar13 = pcVar4;
      }
      pcVar4 = *start;
      iVar3 = pcVar4->x;
      if (iVar3 < iVar2) {
        *start = pcVar12;
        start[1] = pcVar4;
        pcVar13 = *ppcVar11;
        pcVar4 = pcVar12;
        iVar3 = iVar2;
      }
      if (pcVar13->x < iVar3) {
        *start = pcVar13;
        *ppcVar11 = pcVar4;
      }
      while( true ) {
        pcVar4 = *start;
        iVar2 = pcVar4->x;
        lVar5 = (long)ppcVar6 - (long)ppcVar10;
        do {
          pcVar12 = ppcVar10[1];
          ppcVar10 = ppcVar10 + 1;
          lVar5 = lVar5 + -8;
        } while (pcVar12->x < iVar2);
        lVar14 = (long)ppcVar11 - (long)start;
        do {
          pcVar13 = ppcVar11[-1];
          ppcVar11 = ppcVar11 + -1;
          lVar14 = lVar14 + -8;
        } while (iVar2 < pcVar13->x);
        if (ppcVar11 < ppcVar10) break;
        *ppcVar10 = pcVar13;
        *ppcVar11 = pcVar12;
      }
      *start = pcVar13;
      *ppcVar11 = pcVar4;
      ppcVar7 = ppcVar11;
      ppcVar8 = start;
      if (lVar5 < lVar14) {
        ppcVar7 = ppcVar6;
        ppcVar8 = ppcVar10;
        ppcVar10 = start;
        ppcVar6 = ppcVar11;
      }
      *puVar1 = ppcVar10;
      puVar1[1] = ppcVar6;
      puVar1 = puVar1 + 2;
      ppcVar6 = ppcVar7;
      start = ppcVar8;
    }
LAB_001136f8:
    ppcVar11 = ppcVar10 + 1;
    if (ppcVar11 < ppcVar6) {
      pcVar12 = ppcVar10[1];
      iVar2 = pcVar12->x;
      pcVar4 = *ppcVar10;
      ppcVar7 = ppcVar11;
      while (ppcVar10 = ppcVar11, iVar2 < pcVar4->x) {
        *ppcVar7 = pcVar4;
        ppcVar7[-1] = pcVar12;
        if (ppcVar7 + -1 == start) break;
        pcVar4 = ppcVar7[-2];
        ppcVar7 = ppcVar7 + -1;
      }
      goto LAB_001136f8;
    }
    if (puVar1 <= local_2a8) {
      return;
    }
    start = (cell_aa **)puVar1[-2];
    ppcVar6 = (cell_aa **)puVar1[-1];
    puVar1 = puVar1 + -2;
  } while( true );
}

Assistant:

void qsort_cells(Cell** start, unsigned num)
    {
        Cell**  stack[80];
        Cell*** top; 
        Cell**  limit;
        Cell**  base;

        limit = start + num;
        base  = start;
        top   = stack;

        for (;;)
        {
            int len = int(limit - base);

            Cell** i;
            Cell** j;
            Cell** pivot;

            if(len > qsort_threshold)
            {
                // we use base + len/2 as the pivot
                pivot = base + len / 2;
                swap_cells(base, pivot);

                i = base + 1;
                j = limit - 1;

                // now ensure that *i <= *base <= *j 
                if((*j)->x < (*i)->x)
                {
                    swap_cells(i, j);
                }

                if((*base)->x < (*i)->x)
                {
                    swap_cells(base, i);
                }

                if((*j)->x < (*base)->x)
                {
                    swap_cells(base, j);
                }

                for(;;)
                {
                    int x = (*base)->x;
                    do i++; while( (*i)->x < x );
                    do j--; while( x < (*j)->x );

                    if(i > j)
                    {
                        break;
                    }

                    swap_cells(i, j);
                }

                swap_cells(base, j);

                // now, push the largest sub-array
                if(j - base > limit - i)
                {
                    top[0] = base;
                    top[1] = j;
                    base   = i;
                }
                else
                {
                    top[0] = i;
                    top[1] = limit;
                    limit  = j;
                }
                top += 2;
            }
            else
            {
                // the sub-array is small, perform insertion sort
                j = base;
                i = j + 1;

                for(; i < limit; j = i, i++)
                {
                    for(; j[1]->x < (*j)->x; j--)
                    {
                        swap_cells(j + 1, j);
                        if (j == base)
                        {
                            break;
                        }
                    }
                }

                if(top > stack)
                {
                    top  -= 2;
                    base  = top[0];
                    limit = top[1];
                }
                else
                {
                    break;
                }
            }
        }
    }